

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_UTF8Reader.cpp
# Opt level: O3

UTF8Reader * __thiscall soul::UTF8Reader::operator++(UTF8Reader *this)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  
  pbVar2 = (byte *)this->data;
  if (*pbVar2 != 0) {
    this->data = (char *)(pbVar2 + 1);
    bVar1 = *pbVar2;
    if ((bVar1 & 0x40) != 0 && (char)bVar1 < '\0') {
      pbVar3 = pbVar2 + (4 - (ulong)((bVar1 & 0x10) == 0));
      if ((bVar1 & 0x20) == 0) {
        pbVar3 = pbVar2 + 2;
      }
      this->data = (char *)pbVar3;
    }
    return this;
  }
  throwInternalCompilerError("*data != 0","operator++",0x52);
}

Assistant:

UTF8Reader& UTF8Reader::operator++()
{
    SOUL_ASSERT (*data != 0); // trying to advance past the end of the string?
    auto n = (signed char) *data++;

    if (n < 0)
    {
        uint32_t bit = 0x40;

        while ((static_cast<uint32_t> (n) & bit) != 0 && bit > 0x8)
        {
            ++data;
            bit >>= 1;
        }
    }

    return *this;
}